

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_21a823d::Impl::startProcessingMessages(Impl *this,ClosedHandler *onClose)

{
  __int_type _Var1;
  id iVar2;
  thread local_50;
  thread local_48;
  Impl *local_40;
  function<void_()> local_38;
  
  LOCK();
  _Var1 = (this->isProcessingMessages)._M_base._M_i;
  (this->isProcessingMessages)._M_base._M_i = true;
  UNLOCK();
  if ((_Var1 & 1U) != 0) {
    EventHandlers::error(&this->handlers,"Session::startProcessingMessages() called twice");
    return;
  }
  local_40 = this;
  std::function<void_()>::function(&local_38,onClose);
  local_48._M_id._M_thread = (id)0;
  iVar2._M_thread = (native_handle_type)operator_new(0x30);
  *(undefined ***)iVar2._M_thread = &PTR___State_impl_00970138;
  *(Impl **)(iVar2._M_thread + 8) = local_40;
  std::function<void_()>::function((function<void_()> *)(iVar2._M_thread + 0x10),&local_38);
  local_50._M_id._M_thread = (id)(id)iVar2._M_thread;
  std::thread::_M_start_thread(&local_48,&local_50,0);
  if (local_50._M_id._M_thread != 0) {
    (**(code **)(*(long *)local_50._M_id._M_thread + 8))();
  }
  std::thread::operator=(&this->recvThread,&local_48);
  std::thread::~thread(&local_48);
  std::_Function_base::~_Function_base(&local_38.super__Function_base);
  local_50._M_id._M_thread = (id)0;
  local_40 = (Impl *)operator_new(0x10);
  (local_40->super_Session)._vptr_Session = (_func_int **)&PTR___State_00970178;
  *(Impl **)&local_40->isBound = this;
  std::thread::_M_start_thread(&local_50,&local_40,0);
  if (local_40 != (Impl *)0x0) {
    (*(local_40->super_Session)._vptr_Session[1])();
  }
  std::thread::operator=(&this->dispatchThread,&local_50);
  std::thread::~thread(&local_50);
  return;
}

Assistant:

void startProcessingMessages(
      const ClosedHandler& onClose /* = {} */) override {
    if (isProcessingMessages.exchange(true)) {
      handlers.error("Session::startProcessingMessages() called twice");
      return;
    }
    recvThread = std::thread([this, onClose] {
      while (reader.isOpen()) {
        if (auto payload = getPayload()) {
          inbox.put(std::move(payload));
        }
      }
      if (onClose) {
        onClose();
      }
    });

    dispatchThread = std::thread([this] {
      while (auto payload = inbox.take()) {
        payload.value()();
      }
    });
  }